

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall
PrintfTest_NumberIsTooBigInArgIndex_Test::TestBody(PrintfTest_NumberIsTooBigInArgIndex_Test *this)

{
  string_view format;
  string_view format_00;
  bool bVar1;
  AssertHelper *this_00;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  basic_string_view<char> *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe0c;
  char *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  Type in_stack_fffffffffffffe1c;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  char (*in_stack_fffffffffffffe28) [5];
  allocator *format_str;
  Message *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  string local_150 [48];
  string local_120 [38];
  byte local_fa;
  allocator local_f9;
  string local_f8 [32];
  AssertionResult local_d8 [3];
  int local_a4;
  string local_a0 [48];
  string local_70 [38];
  byte local_4a;
  allocator local_49;
  string local_48 [48];
  AssertionResult local_18;
  
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"number is too big",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_4a = 0;
    in_stack_fffffffffffffe77 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffe77) {
      fmt::v5::format<char[5],unsigned_int>
                (in_stack_fffffffffffffe28,
                 (uint *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
      fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      format.size_ = in_stack_fffffffffffffdf8;
      format.data_ = (char *)in_stack_fffffffffffffdf0;
      test_sprintf<>(format);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_a0);
    }
    if ((local_4a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                 (char (*) [119])CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_a4 = 2;
    }
    else {
      local_a4 = 0;
    }
    std::__cxx11::string::~string(local_48);
    if (local_a4 != 0) goto LAB_00113de3;
  }
  else {
LAB_00113de3:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    testing::AssertionResult::failure_message((AssertionResult *)0x113dff);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
               in_stack_fffffffffffffe00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
    testing::Message::~Message((Message *)0x113e5c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113eb4);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d8);
  if (bVar1) {
    format_str = &local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"number is too big",format_str);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    local_fa = 0;
    in_stack_fffffffffffffe27 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffe27) {
      fmt::v5::format<char[6],unsigned_int>
                ((char (*) [6])format_str,
                 (uint *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
      fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      format_00.size_ = in_stack_fffffffffffffdf8;
      format_00.data_ = (char *)in_stack_fffffffffffffdf0;
      test_sprintf<>(format_00);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_150);
    }
    if ((local_fa & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                 (char (*) [120])CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_a4 = 3;
    }
    else {
      local_a4 = 0;
    }
    std::__cxx11::string::~string(local_f8);
    if (local_a4 == 0) goto LAB_00114337;
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x114292);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
             in_stack_fffffffffffffe00);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x1142ef);
LAB_00114337:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x114344);
  return;
}

Assistant:

TEST(PrintfTest, NumberIsTooBigInArgIndex) {
  EXPECT_THROW_MSG(test_sprintf(format("%{}$", BIG_NUM)),
      format_error, "number is too big");
  EXPECT_THROW_MSG(test_sprintf(format("%{}$d", BIG_NUM)),
      format_error, "number is too big");
}